

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O2

TransformDerivative * __thiscall
iDynTree::PrismaticJoint::getTransformDerivative
          (TransformDerivative *__return_storage_ptr__,PrismaticJoint *this,VectorDynSize *jntPos,
          LinkIndex linkA,LinkIndex linkB,int posCoord_i)

{
  int iVar1;
  undefined4 extraout_var;
  TransformDerivative *linkA_dX_linkB;
  double new_q;
  TransformDerivative link1_dX_link2;
  TransformDerivative local_e0;
  Transform local_80 [96];
  
  iVar1 = (*(this->super_MovableJointImpl1).super_IJoint._vptr_IJoint[0x16])(this);
  new_q = (double)iDynTree::VectorDynSize::operator()(jntPos,CONCAT44(extraout_var,iVar1));
  iDynTree::Axis::getTranslationTransformDerivative(new_q);
  iDynTree::TransformDerivative::operator*(&local_e0,local_80);
  if (this->link1 == linkA) {
    iDynTree::TransformDerivative::TransformDerivative(__return_storage_ptr__,&local_e0);
  }
  else {
    updateBuffers(this,new_q);
    iDynTree::TransformDerivative::derivativeOfInverse((Transform *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

TransformDerivative PrismaticJoint::getTransformDerivative(const VectorDynSize& jntPos,
                                                          const LinkIndex linkA,
                                                          const LinkIndex linkB,
                                                          const int posCoord_i) const
{
    const double dist = jntPos(this->getPosCoordsOffset());

    TransformDerivative link1_dX_link2 = translation_axis_wrt_link1.getTranslationTransformDerivative(dist)*link1_X_link2_at_rest;

    if( linkA == this->link1 )
    {
        return link1_dX_link2;
    }
    else
    {
        updateBuffers(dist);
        TransformDerivative linkA_dX_linkB = link1_dX_link2.derivativeOfInverse(this->link1_X_link2);
        return linkA_dX_linkB;
    }
}